

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

void __thiscall QToolBar::QToolBar(QToolBar *this,QWidget *parent)

{
  QWidgetPrivate *this_00;
  
  this_00 = (QWidgetPrivate *)operator_new(0x290);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QToolBarPrivate_0080bed0;
  *(undefined4 *)&this_00->field_0x254 = 0x1010000;
  *(undefined8 *)(this_00 + 1) = 0x10000000f;
  *(undefined8 *)&this_00[1].field_0x8 = 0xffffffff00000000;
  *(undefined4 *)&this_00[1].field_0x10 = 0xffffffff;
  *(undefined8 *)&this_00[1].field_0x20 = 0;
  *(undefined8 *)&this_00[1].field_0x28 = 0;
  *(undefined4 *)&this_00[1].field_0x30 = 0;
  QWidget::QWidget(&this->super_QWidget,this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_0080bb68;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QToolBar_0080bd20;
  QToolBarPrivate::init
            (*(QToolBarPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QToolBar::QToolBar(QWidget *parent)
    : QWidget(*new QToolBarPrivate, parent, { })
{
    Q_D(QToolBar);
    d->init();
}